

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-wast-parser.cc
# Opt level: O1

Errors * anon_unknown.dwarf_12a25e::ParseInvalidModule(Errors *__return_storage_ptr__,string *text)

{
  __uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> _Var1;
  bool bVar2;
  char *message;
  string_view filename;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  Result result;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  WastLexer *local_58;
  __uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> local_50;
  Result local_44;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  WastParseOptions local_25;
  
  filename.size_ = (size_type)"test";
  filename.data_ = (char *)&local_58;
  wabt::WastLexer::CreateBufferLexer(filename,(void *)0x4,(size_t)(text->_M_dataplus)._M_p);
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       (tuple<wabt::Module_*,_std::default_delete<wabt::Module>_>)
       (_Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>)0x0;
  local_25.features.exceptions_enabled_ = false;
  local_25.features.mutable_globals_enabled_ = true;
  local_25.features.sat_float_to_int_enabled_ = false;
  local_25.features.sign_extension_enabled_ = false;
  local_25.features.simd_enabled_ = false;
  local_25.features.threads_enabled_ = false;
  local_25.features.multi_value_enabled_ = false;
  local_25.features.tail_call_enabled_ = false;
  local_25.features.bulk_memory_enabled_ = false;
  local_25.features.reference_types_enabled_ = false;
  local_25.features.annotations_enabled_ = false;
  local_25.features.gc_enabled_ = false;
  local_25.debug_parsing = false;
  local_44 = wabt::ParseWatModule
                       (local_58,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                                 &local_50,__return_storage_ptr__,&local_25);
  local_60.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            (local_40,"Result::Error","result",(Enum *)&local_60,&local_44);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-wast-parser.cc"
               ,0x2b,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  _Var1._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       local_50._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
       super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl;
  if ((_Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>)
      local_50._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
      super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl != (Module *)0x0) {
    wabt::Module::~Module
              ((Module *)
               local_50._M_t.
               super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
               super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
    operator_delete((void *)_Var1._M_t.
                            super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                            .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
  }
  if (local_58 != (WastLexer *)0x0) {
    std::default_delete<wabt::WastLexer>::operator()
              ((default_delete<wabt::WastLexer> *)&local_58,local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

Errors ParseInvalidModule(std::string text) {
  auto lexer = WastLexer::CreateBufferLexer("test", text.c_str(), text.size());
  Errors errors;
  std::unique_ptr<Module> module;
  Features features;
  WastParseOptions options(features);
  Result result = ParseWatModule(lexer.get(), &module, &errors, &options);
  EXPECT_EQ(Result::Error, result);

  return errors;
}